

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.h
# Opt level: O3

void __thiscall icu_63::SortKeyByteSink::Append(SortKeyByteSink *this,uint32_t b)

{
  int iVar1;
  
  if (0 < this->ignore_) {
    this->ignore_ = this->ignore_ + -1;
    return;
  }
  iVar1 = this->appended_;
  if (this->capacity_ <= iVar1) {
    iVar1 = (*(this->super_ByteSink)._vptr_ByteSink[6])(this,1);
    if ((char)iVar1 == '\0') goto LAB_0022e240;
    iVar1 = this->appended_;
  }
  this->buffer_[iVar1] = (char)b;
LAB_0022e240:
  this->appended_ = this->appended_ + 1;
  return;
}

Assistant:

void Append(uint32_t b) {
        if (ignore_ > 0) {
            --ignore_;
        } else {
            if (appended_ < capacity_ || Resize(1, appended_)) {
                buffer_[appended_] = (char)b;
            }
            ++appended_;
        }
    }